

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::binary16::writer<std::wostream>
          (binary16 *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  byte bVar1;
  byte *pbVar2;
  long *plVar3;
  wostream *pwVar4;
  size_t sVar5;
  uint uVar6;
  const_iterator __begin3;
  byte *pbVar7;
  uint uVar8;
  array<wchar_t,_3UL> hex;
  wchar_t local_44;
  int local_40;
  undefined4 local_3c;
  indent *local_38;
  
  local_38 = ind;
  std::operator<<(os,"!!binary16 |");
  pbVar7 = *(byte **)&this->v_;
  pbVar2 = *(byte **)&this->field_0x10;
  if (pbVar7 == pbVar2) {
    plVar3 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar3 == (long *)0x0) goto LAB_0010d87e;
    local_44 = (**(code **)(*plVar3 + 0x50))(plVar3,10);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_44,1);
    operator<<(pwVar4,local_38);
  }
  else {
    uVar6 = 0;
    do {
      bVar1 = *pbVar7;
      if (uVar6 - 0x10 < 0xfffffff1) {
        plVar3 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar3 == (long *)0x0) goto LAB_0010d87e;
        local_44 = (**(code **)(*plVar3 + 0x50))(plVar3,10);
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_44,1);
        operator<<(pwVar4,local_38);
        uVar6 = 0;
      }
      else if ((uVar6 & 1) == 0) {
        plVar3 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar3 == (long *)0x0) goto LAB_0010d87e;
        local_44 = (**(code **)(*plVar3 + 0x50))(plVar3,0x20);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_44,1);
      }
      local_44 = bVar1 >> 4 | 0x30;
      if (0x9f < bVar1) {
        local_44 = (uint)(bVar1 >> 4) + L'7';
      }
      uVar8 = bVar1 & 0xf;
      local_40 = uVar8 + 0x30;
      if (9 < uVar8) {
        local_40 = uVar8 + 0x37;
      }
      local_3c = 0;
      sVar5 = wcslen(&local_44);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_44,sVar5);
      uVar6 = uVar6 + 1;
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  plVar3 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
  if (plVar3 != (long *)0x0) {
    local_44 = (**(code **)(*plVar3 + 0x50))(plVar3,0x3e);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_44,1);
    return pwVar4;
  }
LAB_0010d87e:
  std::__throw_bad_cast();
}

Assistant:

OStream & binary16::writer (OStream & os, indent const & ind) const {
            os << "!!binary16 |";
            if (v_.empty ()) {
                os << '\n' << ind;
            } else {
                using char_type = typename OStream::char_type;
                constexpr auto bytes_per_row = 8U * 2U;
                auto byte_no = 0U;
                for (std::uint8_t const b : v_) {
                    if (byte_no == 0U || byte_no >= bytes_per_row) {
                        // Line wrap and indent on the first iteration or when we run out of width.
                        os << '\n' << ind;
                        byte_no = 0U;
                    } else if (byte_no % 2U == 0U) {
                        // Values grouped into two-byte pairs.
                        os << ' ';
                    }
                    std::array<char_type, 3> const hex{{to_hex<char_type> ((b >> 4U) & 0x0FU),
                                                        to_hex<char_type> (b & 0x0FU), '\0'}};
                    os << hex.data ();
                    ++byte_no;
                }
            }
            return os << '>';
        }